

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# fasttext_api.h
# Opt level: O0

void __thiscall TestMeter::TestMeter(TestMeter *this,Meter *meter)

{
  undefined1 auVar1 [16];
  bool bVar2;
  size_type sVar3;
  pointer ppVar4;
  ulong uVar5;
  pointer ppVar6;
  reference this_00;
  pair<float,_float> pVar7;
  uint64_t in_RSI;
  Metrics *in_RDI;
  pair<const_int,_fasttext::Meter::Metrics> *pair;
  iterator __end1;
  iterator __begin1;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *__range1;
  int cnt;
  unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
  *in_stack_ffffffffffffffa8;
  TestMetrics *in_stack_ffffffffffffffc0;
  _Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false> local_38;
  _Node_iterator_base<std::pair<const_int,_fasttext::Meter::Metrics>,_false> local_30;
  long local_28;
  int local_20;
  uint64_t local_10;
  
  in_RDI->gold = *(uint64_t *)(in_RSI + 0x30);
  local_10 = in_RSI;
  sVar3 = std::
          unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
          ::size((unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
                  *)0x1f5052);
  in_RDI->predicted = sVar3;
  in_RDI->predictedGold = local_10;
  ppVar4 = (pointer)operator_new(0x30);
  TestMetrics::TestMetrics(in_stack_ffffffffffffffc0,(int)((ulong)ppVar4 >> 0x20),in_RDI);
  (in_RDI->scoreVsTrue).
  super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
  super__Vector_impl_data._M_start = ppVar4;
  if (in_RDI->predicted == 0) {
    (in_RDI->scoreVsTrue).
    super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = (pointer)0x0;
  }
  else {
    auVar1._8_8_ = 0;
    auVar1._0_8_ = in_RDI->predicted;
    uVar5 = SUB168(auVar1 * ZEXT816(8),0);
    if (SUB168(auVar1 * ZEXT816(8),8) != 0) {
      uVar5 = 0xffffffffffffffff;
    }
    ppVar6 = (pointer)operator_new__(uVar5);
    (in_RDI->scoreVsTrue).
    super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl.
    super__Vector_impl_data._M_finish = ppVar6;
    local_20 = -1;
    local_28 = local_10 + 0x38;
    local_30._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
         ::begin(in_stack_ffffffffffffffa8);
    local_38._M_cur =
         (__node_type *)
         std::
         unordered_map<int,_fasttext::Meter::Metrics,_std::hash<int>,_std::equal_to<int>,_std::allocator<std::pair<const_int,_fasttext::Meter::Metrics>_>_>
         ::end(in_stack_ffffffffffffffa8);
    while (bVar2 = std::__detail::operator!=(&local_30,&local_38), bVar2) {
      this_00 = std::__detail::
                _Node_iterator<std::pair<const_int,_fasttext::Meter::Metrics>,_false,_false>::
                operator*((_Node_iterator<std::pair<const_int,_fasttext::Meter::Metrics>,_false,_false>
                           *)0x1f515f);
      pVar7 = (pair<float,_float>)operator_new(0x30);
      TestMetrics::TestMetrics((TestMetrics *)this_00,(int)((ulong)ppVar4 >> 0x20),in_RDI);
      local_20 = local_20 + 1;
      (in_RDI->scoreVsTrue).
      super__Vector_base<std::pair<float,_float>,_std::allocator<std::pair<float,_float>_>_>._M_impl
      .super__Vector_impl_data._M_finish[local_20] = pVar7;
      std::__detail::_Node_iterator<std::pair<const_int,_fasttext::Meter::Metrics>,_false,_false>::
      operator++((_Node_iterator<std::pair<const_int,_fasttext::Meter::Metrics>,_false,_false> *)
                 in_RDI);
    }
  }
  return;
}

Assistant:

explicit TestMeter(Meter* meter)
    {
        nexamples = meter->nexamples_;
        nlabels = meter->labelMetrics_.size();
        sourceMeter = meter;
        metrics = new TestMetrics(-1, meter->metrics_);

        if (nlabels == 0)
        {
            labelMetrics = nullptr;
            return;
        }

        labelMetrics = new TestMetrics*[nlabels];

        int cnt = -1;
        for (auto& pair : meter->labelMetrics_)
        {
            labelMetrics[++cnt] = new TestMetrics(pair.first, pair.second);
        }
    }